

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcplisten.c
# Opt level: O3

int tcp_listener_get_locaddr(void *arg,void *buf,size_t *szp,nni_type t)

{
  int iVar1;
  undefined1 local_140 [8];
  sockaddr_storage ss;
  nng_sockaddr sa;
  socklen_t len;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x130));
  if (*(char *)((long)arg + 0x128) == '\x01') {
    sa.s_storage.sa_pad[0xf]._4_4_ = 0x80;
    iVar1 = nni_posix_pfd_fd((nni_posix_pfd *)((long)arg + 0xd8));
    getsockname(iVar1,(sockaddr *)local_140,(socklen_t *)((long)sa.s_storage.sa_pad + 0x7c));
    nni_posix_sockaddr2nn
              ((nni_sockaddr *)&ss.__ss_align,local_140,(ulong)(uint)sa.s_storage.sa_pad[0xf]._4_4_)
    ;
  }
  else {
    ss.__ss_align._0_2_ = 0;
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x130));
  iVar1 = nni_copyout_sockaddr((nng_sockaddr *)&ss.__ss_align,buf,szp,t);
  return iVar1;
}

Assistant:

static int
tcp_listener_get_locaddr(void *arg, void *buf, size_t *szp, nni_type t)
{
	tcp_listener *l = arg;
	nng_sockaddr  sa;
	nni_mtx_lock(&l->mtx);
	if (l->started) {
		struct sockaddr_storage ss;
		socklen_t               len = sizeof(ss);
		(void) getsockname(
		    nni_posix_pfd_fd(&l->pfd), (void *) &ss, &len);
		(void) nni_posix_sockaddr2nn(&sa, &ss, len);
	} else {
		sa.s_family = NNG_AF_UNSPEC;
	}
	nni_mtx_unlock(&l->mtx);
	return (nni_copyout_sockaddr(&sa, buf, szp, t));
}